

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KDataStream.cpp
# Opt level: O2

KString * __thiscall
KDIS::KDataStream::GetAsString_abi_cxx11_(KString *__return_storage_ptr__,KDataStream *this)

{
  byte *pbVar1;
  ostream *poVar2;
  byte *pbVar3;
  KStringStream ss;
  stringstream asStack_1b8 [16];
  long local_1a8 [3];
  uint auStack_190 [88];
  
  std::__cxx11::stringstream::stringstream(asStack_1b8);
  pbVar1 = (this->m_vBuffer).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  for (pbVar3 = (this->m_vBuffer).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                _M_impl.super__Vector_impl_data._M_start; pbVar3 != pbVar1; pbVar3 = pbVar3 + 1) {
    if (*pbVar3 < 10) {
      std::operator<<((ostream *)local_1a8,"0");
    }
    *(uint *)((long)auStack_190 + *(long *)(local_1a8[0] + -0x18)) =
         *(uint *)((long)auStack_190 + *(long *)(local_1a8[0] + -0x18)) & 0xffffffb5 | 8;
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)local_1a8,(ushort)*pbVar3);
    std::operator<<(poVar2," ");
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(asStack_1b8);
  return __return_storage_ptr__;
}

Assistant:

KString KDataStream::GetAsString() const
{
    KStringStream ss;

    auto citr = m_vBuffer.begin();
    auto citrEnd = m_vBuffer.end();

    for( ; citr != citrEnd; ++citr )
    {
        // If less than 10 add a zero so that each octet has the same 2 digit
        // representation.
        if( *citr < 10 )ss << "0";

        ss << hex << ( KUINT16 )*citr << " ";
    }

    return ss.str();
}